

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall wasm::MultiMemoryLowering::Replacer::walkFunction(Replacer *this,Function *func)

{
  MultiMemoryLowering *pMVar1;
  IString *pIVar2;
  pointer pNVar3;
  
  pMVar1 = this->parent;
  pNVar3 = (pMVar1->memorySizeNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_start;
  while (pNVar3 != (pMVar1->memorySizeNames).
                   super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
    pIVar2 = &pNVar3->super_IString;
    pNVar3 = pNVar3 + 1;
    if ((pIVar2->str)._M_str == (func->super_Importable).super_Named.name.super_IString.str._M_str)
    {
      return;
    }
  }
  pNVar3 = (pMVar1->memoryGrowNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pNVar3 == (pMVar1->memoryGrowNames).
                  super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
      ::walkFunction(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                      ).
                      super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                      .
                      super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                     ,func);
      return;
    }
    pIVar2 = &pNVar3->super_IString;
    pNVar3 = pNVar3 + 1;
  } while ((pIVar2->str)._M_str !=
           (func->super_Importable).super_Named.name.super_IString.str._M_str);
  return;
}

Assistant:

void walkFunction(Function* func) {
      for (Name funcName : parent.memorySizeNames) {
        if (funcName == func->name) {
          return;
        }
      }
      for (Name funcName : parent.memoryGrowNames) {
        if (funcName == func->name) {
          return;
        }
      }
      Super::walkFunction(func);
    }